

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::FBXConverter::SetShadingPropertiesRaw
          (FBXConverter *this,aiMaterial *out_mat,PropertyTable *props,TextureMap *textures,
          MeshGeometry *mesh)

{
  undefined8 uVar1;
  ulong __n;
  PropertyTable *this_00;
  byte bVar2;
  aiMaterial *paVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  mapped_type *pmVar10;
  Property *pPVar11;
  __normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_> _Var12
  ;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvVar13;
  long *plVar14;
  MeshGeometry *this_01;
  MatIndexArray *pMVar15;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var16;
  undefined8 *puVar17;
  size_type *psVar18;
  _Self __tmp;
  size_t __n_00;
  char *pcVar19;
  bool bVar20;
  bool bVar21;
  int uvIndex;
  string name;
  uint matIndex;
  string prefix;
  Video *media;
  int value;
  uint local_6b4;
  aiMaterial *local_6b0;
  FBXConverter *local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  _Base_ptr local_620;
  MeshGeometry *local_618;
  undefined4 local_60c;
  _Rb_tree_header *local_608;
  _Base_ptr local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  VideoMap *local_5d8;
  _Base_ptr local_5d0;
  Video *local_5c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
  local_5c0 [2];
  ios_base local_550 [264];
  undefined4 local_448;
  undefined4 uStack_444;
  undefined4 uStack_440;
  undefined4 uStack_43c;
  undefined4 local_438;
  aiString local_434;
  
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  local_6b0 = out_mat;
  local_620 = (_Base_ptr)textures;
  local_618 = mesh;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"$raw.","");
  PropertyTable::GetUnparsedProperties_abi_cxx11_((DirectPropertyMap *)local_5c0,props);
  p_Var9 = &local_5c0[0]._M_impl.super__Rb_tree_header;
  local_6a8 = this;
  if ((_Rb_tree_header *)local_5c0[0]._M_impl.super__Rb_tree_header._M_header._M_left != p_Var9) {
    p_Var8 = local_5c0[0]._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::operator+(&local_680,&local_5f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var8 + 1));
      uVar1 = *(undefined8 *)(p_Var8 + 2);
      lVar7 = __dynamic_cast(uVar1,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,0
                            );
      if (lVar7 == 0) {
        lVar7 = __dynamic_cast(uVar1,&Property::typeinfo,&TypedProperty<aiColor3D>::typeinfo,0);
        if (lVar7 == 0) {
          lVar7 = __dynamic_cast(uVar1,&Property::typeinfo,
                                 &TypedProperty<aiColor4t<float>>::typeinfo,0);
          if (lVar7 == 0) {
            lVar7 = __dynamic_cast(uVar1,&Property::typeinfo,&TypedProperty<float>::typeinfo,0);
            if (lVar7 == 0) {
              lVar7 = __dynamic_cast(uVar1,&Property::typeinfo,&TypedProperty<int>::typeinfo,0);
              if (lVar7 == 0) {
                lVar7 = __dynamic_cast(uVar1,&Property::typeinfo,&TypedProperty<bool>::typeinfo,0);
                if (lVar7 == 0) {
                  lVar7 = __dynamic_cast(uVar1,&Property::typeinfo,
                                         &TypedProperty<std::__cxx11::string>::typeinfo,0);
                  if (lVar7 != 0) {
                    __n_00 = *(ulong *)(lVar7 + 0x10) & 0xffffffff;
                    if ((*(ulong *)(lVar7 + 0x10) & 0xfffffc00) != 0) {
                      __n_00 = 0x3ff;
                    }
                    local_434.length = (ai_uint32)__n_00;
                    memcpy(local_434.data,*(void **)(lVar7 + 8),__n_00);
                    local_434.data[__n_00] = '\0';
                    aiMaterial::AddProperty(local_6b0,&local_434,local_680._M_dataplus._M_p,0,0);
                  }
                }
                else {
                  local_434.length = (ai_uint32)*(byte *)(lVar7 + 8);
                  aiMaterial::AddBinaryProperty
                            (local_6b0,&local_434,4,local_680._M_dataplus._M_p,0,0,aiPTI_Integer);
                }
              }
              else {
                aiMaterial::AddBinaryProperty
                          (local_6b0,(void *)(lVar7 + 8),4,local_680._M_dataplus._M_p,0,0,
                           aiPTI_Integer);
              }
            }
            else {
              aiMaterial::AddBinaryProperty
                        (local_6b0,(void *)(lVar7 + 8),4,local_680._M_dataplus._M_p,0,0,aiPTI_Float)
              ;
            }
          }
          else {
            aiMaterial::AddBinaryProperty
                      (local_6b0,(void *)(lVar7 + 8),0x10,local_680._M_dataplus._M_p,0,0,aiPTI_Float
                      );
          }
        }
        else {
          aiMaterial::AddBinaryProperty
                    (local_6b0,(void *)(lVar7 + 8),0xc,local_680._M_dataplus._M_p,0,0,aiPTI_Float);
        }
      }
      else {
        aiMaterial::AddBinaryProperty
                  (local_6b0,(void *)(lVar7 + 8),0xc,local_680._M_dataplus._M_p,0,0,aiPTI_Float);
      }
      this = local_6a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_680._M_dataplus._M_p != &local_680.field_2) {
        operator_delete(local_680._M_dataplus._M_p);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var9);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
  ::~_Rb_tree(local_5c0);
  p_Var8 = (((_Rep_type *)&local_620->_M_color)->_M_impl).super__Rb_tree_header._M_header._M_left;
  local_620 = &(((_Rep_type *)&local_620->_M_color)->_M_impl).super__Rb_tree_header._M_header;
  if (p_Var8 != local_620) {
    local_5d8 = &this->textures_converted;
    local_608 = &(this->textures_converted)._M_t._M_impl.super__Rb_tree_header;
    local_600 = &(this->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      std::operator+(&local_680,&local_5f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var8 + 1));
      lVar7 = *(long *)(p_Var8 + 2);
      if (lVar7 != 0) {
        local_434.length = 0;
        local_434.data[0] = '\0';
        local_5d0 = p_Var8;
        memset(local_434.data + 1,0x1b,0x3ff);
        __n = *(ulong *)(lVar7 + 0x70);
        if (__n < 0x400) {
          local_434.length = (ai_uint32)__n;
          memcpy(local_434.data,*(void **)(lVar7 + 0x68),__n);
          local_434.data[__n] = '\0';
        }
        local_5c8 = *(Video **)(lVar7 + 0xe8);
        if ((local_5c8 != (Video *)0x0) && (local_5c8->contentLength != 0)) {
          p_Var8 = (this->textures_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
          ;
          p_Var9 = local_608;
          if (p_Var8 == (_Base_ptr)0x0) {
LAB_00174724:
            uVar4 = ConvertVideo(this,local_5c8);
            pmVar10 = std::
                      map<const_Assimp::FBX::Video_*,_unsigned_int,_std::less<const_Assimp::FBX::Video_*>,_std::allocator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_>_>
                      ::operator[](local_5d8,&local_5c8);
            *pmVar10 = uVar4;
          }
          else {
            do {
              if (*(Video **)(p_Var8 + 1) >= local_5c8) {
                p_Var9 = (_Rb_tree_header *)p_Var8;
              }
              p_Var8 = (&p_Var8->_M_left)[*(Video **)(p_Var8 + 1) < local_5c8];
            } while (p_Var8 != (_Base_ptr)0x0);
            if ((p_Var9 == local_608) || (local_5c8 < (Video *)p_Var9->_M_node_count))
            goto LAB_00174724;
            uVar4 = *(uint *)(p_Var9 + 1);
          }
          local_434.data[0] = '*';
          local_434.length = 1;
          if ((int)uVar4 < 0) {
            local_434.data[1] = '-';
            uVar4 = -uVar4;
            local_434.length = 2;
            pcVar19 = local_434.data + 2;
          }
          else {
            pcVar19 = local_434.data + 1;
          }
          iVar5 = 1000000000;
          bVar2 = 0;
          do {
            bVar20 = (int)((long)(int)uVar4 / (long)iVar5) != 0;
            bVar21 = iVar5 == 1;
            if ((bool)(bVar2 | bVar21 | bVar20)) {
              *pcVar19 = (char)((long)(int)uVar4 / (long)iVar5) + '0';
              pcVar19 = pcVar19 + 1;
              local_434.length = local_434.length + 1;
              uVar4 = (int)uVar4 % iVar5;
              if (iVar5 == 1) break;
            }
            iVar5 = iVar5 / 10;
            bVar2 = bVar2 | bVar21 | bVar20;
          } while (local_434.length < 0x3ff);
          *pcVar19 = '\0';
          this = local_6a8;
        }
        paVar3 = local_6b0;
        local_5c0[0]._M_impl._0_8_ = &local_5c0[0]._M_impl.super__Rb_tree_header._M_header._M_parent
        ;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5c0,local_680._M_dataplus._M_p,
                   local_680._M_dataplus._M_p + local_680._M_string_length);
        std::__cxx11::string::append((char *)local_5c0);
        aiMaterial::AddProperty(paVar3,&local_434,(char *)local_5c0[0]._M_impl._0_8_,0x12,0);
        if ((_Base_ptr *)local_5c0[0]._M_impl._0_8_ !=
            &local_5c0[0]._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_5c0[0]._M_impl._0_8_);
        }
        paVar3 = local_6b0;
        local_438 = 0;
        local_448 = *(undefined4 *)(lVar7 + 0x38);
        uStack_444 = *(undefined4 *)(lVar7 + 0x3c);
        uStack_440 = *(undefined4 *)(lVar7 + 0x40);
        uStack_43c = *(undefined4 *)(lVar7 + 0x44);
        local_5c0[0]._M_impl._0_8_ = &local_5c0[0]._M_impl.super__Rb_tree_header._M_header._M_parent
        ;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5c0,local_680._M_dataplus._M_p,
                   local_680._M_dataplus._M_p + local_680._M_string_length);
        std::__cxx11::string::append((char *)local_5c0);
        aiMaterial::AddBinaryProperty
                  (paVar3,&local_448,0x14,(char *)local_5c0[0]._M_impl._0_8_,0x12,0,aiPTI_Float);
        if ((_Base_ptr *)local_5c0[0]._M_impl._0_8_ !=
            &local_5c0[0]._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_5c0[0]._M_impl._0_8_);
        }
        local_6b4 = 0;
        this_00 = *(PropertyTable **)(lVar7 + 200);
        if (this_00 == (PropertyTable *)0x0) {
          __assert_fail("props.get()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXDocument.h"
                        ,0x1f7,"const PropertyTable &Assimp::FBX::Texture::Props() const");
        }
        local_5c0[0]._M_impl._0_8_ = &local_5c0[0]._M_impl.super__Rb_tree_header._M_header._M_parent
        ;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"UVSet","");
        pPVar11 = PropertyTable::Get(this_00,(string *)local_5c0);
        if ((pPVar11 == (Property *)0x0) ||
           (lVar7 = __dynamic_cast(pPVar11,&Property::typeinfo,
                                   &TypedProperty<std::__cxx11::string>::typeinfo,0), lVar7 == 0)) {
          local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
          local_660._M_string_length = 0;
          local_660.field_2._M_local_buf[0] = '\0';
          bVar20 = false;
        }
        else {
          local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
          bVar20 = true;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_660,*(long *)(lVar7 + 8),
                     *(long *)(lVar7 + 0x10) + *(long *)(lVar7 + 8));
        }
        if ((_Base_ptr *)local_5c0[0]._M_impl._0_8_ !=
            &local_5c0[0]._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_5c0[0]._M_impl._0_8_);
        }
        if (((bVar20) && (iVar5 = std::__cxx11::string::compare((char *)&local_660), iVar5 != 0)) &&
           (local_660._M_string_length != 0)) {
          _Var12 = std::
                   __find_if<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,__gnu_cxx::__ops::_Iter_equals_val<aiMaterial*const>>
                             ((this->materials).
                              super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (this->materials).
                              super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish,&local_6b0);
          local_60c = (undefined4)
                      ((ulong)((long)_Var12._M_current -
                              (long)(this->materials).
                                    super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 3);
          local_6b4 = 0xffffffff;
          if (local_618 == (MeshGeometry *)0x0) {
            p_Var8 = (this->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            if (p_Var8 != local_600) {
              do {
                uVar4 = local_6b4;
                if ((*(long *)(p_Var8 + 1) != 0) &&
                   (this_01 = (MeshGeometry *)
                              __dynamic_cast(*(long *)(p_Var8 + 1),&Geometry::typeinfo,
                                             &MeshGeometry::typeinfo,0), uVar4 = local_6b4,
                   this_01 != (MeshGeometry *)0x0)) {
                  pMVar15 = MeshGeometry::GetMaterialIndices(this_01);
                  _Var16 = std::
                           __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                                     ((pMVar15->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (pMVar15->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_finish,&local_60c);
                  uVar4 = local_6b4;
                  if (_Var16._M_current !=
                      (pMVar15->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish) {
                    uVar4 = 0xffffffff;
                    uVar6 = 0;
                    do {
                      pvVar13 = MeshGeometry::GetTextureCoords(this_01,uVar6);
                      if ((pvVar13->
                          super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start ==
                          (pvVar13->
                          super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish) break;
                      MeshGeometry::GetTextureCoordChannelName_abi_cxx11_
                                ((string *)local_5c0,this_01,uVar6);
                      uVar1 = local_5c0[0]._M_impl._0_8_;
                      if (local_5c0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ ==
                          local_660._M_string_length) {
                        if (local_5c0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
                          bVar20 = false;
                          uVar4 = uVar6;
                        }
                        else {
                          iVar5 = bcmp((void *)local_5c0[0]._M_impl._0_8_,local_660._M_dataplus._M_p
                                       ,local_5c0[0]._M_impl.super__Rb_tree_header._M_header._0_8_);
                          bVar20 = iVar5 != 0;
                          if (!bVar20) {
                            uVar4 = uVar6;
                          }
                        }
                      }
                      else {
                        bVar20 = true;
                      }
                      if ((_Base_ptr *)uVar1 !=
                          &local_5c0[0]._M_impl.super__Rb_tree_header._M_header._M_parent) {
                        operator_delete((void *)uVar1);
                      }
                      bVar21 = uVar6 < 7;
                      uVar6 = uVar6 + 1;
                    } while ((bool)(bVar20 & bVar21));
                    if (uVar4 == 0xffffffff) {
                      std::operator+(&local_640,"did not find UV channel named ",&local_660);
                      puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_640);
                      local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
                      psVar18 = puVar17 + 2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar17 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar18) {
                        local_6a0.field_2._M_allocated_capacity = *psVar18;
                        local_6a0.field_2._8_8_ = puVar17[3];
                      }
                      else {
                        local_6a0.field_2._M_allocated_capacity = *psVar18;
                        local_6a0._M_dataplus._M_p = (pointer)*puVar17;
                      }
                      local_6a0._M_string_length = puVar17[1];
                      *puVar17 = psVar18;
                      puVar17[1] = 0;
                      *(undefined1 *)(puVar17 + 2) = 0;
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      basic_formatter<std::__cxx11::string>
                                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                  *)local_5c0,&local_6a0);
                      LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5c0);
                    }
                    else {
                      if (local_6b4 == 0xffffffff) goto LAB_00174db9;
                      std::operator+(&local_640,"the UV channel named ",&local_660);
                      puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_640);
                      local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
                      psVar18 = puVar17 + 2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar17 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar18) {
                        local_6a0.field_2._M_allocated_capacity = *psVar18;
                        local_6a0.field_2._8_8_ = puVar17[3];
                      }
                      else {
                        local_6a0.field_2._M_allocated_capacity = *psVar18;
                        local_6a0._M_dataplus._M_p = (pointer)*puVar17;
                      }
                      local_6a0._M_string_length = puVar17[1];
                      *puVar17 = psVar18;
                      puVar17[1] = 0;
                      *(undefined1 *)(puVar17 + 2) = 0;
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      basic_formatter<std::__cxx11::string>
                                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                  *)local_5c0,&local_6a0);
                      LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5c0);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
                    std::ios_base::~ios_base(local_550);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
                      operator_delete(local_6a0._M_dataplus._M_p);
                    }
                    uVar4 = local_6b4;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_640._M_dataplus._M_p != &local_640.field_2) {
                      operator_delete(local_640._M_dataplus._M_p);
                      uVar4 = local_6b4;
                    }
                  }
                }
LAB_00174db9:
                local_6b4 = uVar4;
                p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
                uVar4 = local_6b4;
              } while (p_Var8 != local_600);
              goto LAB_00174e6f;
            }
LAB_00174e78:
            std::operator+(&local_640,"failed to resolve UV channel ",&local_660);
            puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_640);
            psVar18 = puVar17 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar17 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar18) {
              local_6a0.field_2._M_allocated_capacity = *psVar18;
              local_6a0.field_2._8_8_ = puVar17[3];
              local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
            }
            else {
              local_6a0.field_2._M_allocated_capacity = *psVar18;
              local_6a0._M_dataplus._M_p = (pointer)*puVar17;
            }
            local_6a0._M_string_length = puVar17[1];
            *puVar17 = psVar18;
            puVar17[1] = 0;
            *(undefined1 *)(puVar17 + 2) = 0;
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
            basic_formatter<std::__cxx11::string>
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       local_5c0,&local_6a0);
            LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5c0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
            std::ios_base::~ios_base(local_550);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
              operator_delete(local_6a0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_640._M_dataplus._M_p != &local_640.field_2) {
              operator_delete(local_640._M_dataplus._M_p);
            }
            local_6b4 = 0;
            this = local_6a8;
          }
          else {
            uVar4 = 0xffffffff;
            uVar6 = 0;
            do {
              pvVar13 = MeshGeometry::GetTextureCoords(local_618,uVar6);
              if ((pvVar13->
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start ==
                  (pvVar13->
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish) break;
              MeshGeometry::GetTextureCoordChannelName_abi_cxx11_
                        ((string *)local_5c0,local_618,uVar6);
              uVar1 = local_5c0[0]._M_impl._0_8_;
              if (local_5c0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ ==
                  local_660._M_string_length) {
                if (local_5c0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
                  bVar20 = false;
                  uVar4 = uVar6;
                }
                else {
                  iVar5 = bcmp((void *)local_5c0[0]._M_impl._0_8_,local_660._M_dataplus._M_p,
                               local_5c0[0]._M_impl.super__Rb_tree_header._M_header._0_8_);
                  bVar20 = iVar5 != 0;
                  if (!bVar20) {
                    uVar4 = uVar6;
                  }
                }
              }
              else {
                bVar20 = true;
              }
              if ((_Base_ptr *)uVar1 !=
                  &local_5c0[0]._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)uVar1);
              }
              bVar21 = uVar6 < 7;
              uVar6 = uVar6 + 1;
            } while ((bool)(bVar20 & bVar21));
            if (uVar4 == 0xffffffff) {
              std::operator+(&local_640,"did not find UV channel named ",&local_660);
              plVar14 = (long *)std::__cxx11::string::append((char *)&local_640);
              local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
              psVar18 = (size_type *)(plVar14 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar14 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar18) {
                local_6a0.field_2._M_allocated_capacity = *psVar18;
                local_6a0.field_2._8_8_ = plVar14[3];
              }
              else {
                local_6a0.field_2._M_allocated_capacity = *psVar18;
                local_6a0._M_dataplus._M_p = (pointer)*plVar14;
              }
              local_6a0._M_string_length = plVar14[1];
              *plVar14 = (long)psVar18;
              plVar14[1] = 0;
              *(undefined1 *)(plVar14 + 2) = 0;
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              basic_formatter<std::__cxx11::string>
                        ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         local_5c0,&local_6a0);
              LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5c0);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c0);
              std::ios_base::~ios_base(local_550);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
                operator_delete(local_6a0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_640._M_dataplus._M_p != &local_640.field_2) {
                operator_delete(local_640._M_dataplus._M_p);
              }
            }
            this = local_6a8;
            if (local_6b4 == 0xffffffff) {
LAB_00174e6f:
              local_6b4 = uVar4;
              this = local_6a8;
              if (local_6b4 == 0xffffffff) goto LAB_00174e78;
            }
          }
        }
        paVar3 = local_6b0;
        local_5c0[0]._M_impl._0_8_ = &local_5c0[0]._M_impl.super__Rb_tree_header._M_header._M_parent
        ;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5c0,local_680._M_dataplus._M_p,
                   local_680._M_dataplus._M_p + local_680._M_string_length);
        std::__cxx11::string::append((char *)local_5c0);
        aiMaterial::AddBinaryProperty
                  (paVar3,&local_6b4,4,(char *)local_5c0[0]._M_impl._0_8_,0x12,0,aiPTI_Integer);
        p_Var8 = local_5d0;
        if ((_Base_ptr *)local_5c0[0]._M_impl._0_8_ !=
            &local_5c0[0]._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_5c0[0]._M_impl._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_660._M_dataplus._M_p != &local_660.field_2) {
          operator_delete(local_660._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_680._M_dataplus._M_p != &local_680.field_2) {
        operator_delete(local_680._M_dataplus._M_p);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != local_620);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void FBXConverter::SetShadingPropertiesRaw(aiMaterial* out_mat, const PropertyTable& props, const TextureMap& textures, const MeshGeometry* const mesh)
{
    // Add all the unparsed properties with a "$raw." prefix

    const std::string prefix = "$raw.";

    for (const DirectPropertyMap::value_type& prop : props.GetUnparsedProperties()) {

        std::string name = prefix + prop.first;

        if (const TypedProperty<aiVector3D>* interpreted = prop.second->As<TypedProperty<aiVector3D> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<aiColor3D>* interpreted = prop.second->As<TypedProperty<aiColor3D> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<aiColor4D>* interpreted = prop.second->As<TypedProperty<aiColor4D> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<float>* interpreted = prop.second->As<TypedProperty<float> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<int>* interpreted = prop.second->As<TypedProperty<int> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<bool>* interpreted = prop.second->As<TypedProperty<bool> >())
        {
            int value = interpreted->Value() ? 1 : 0;
            out_mat->AddProperty(&value, 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<std::string>* interpreted = prop.second->As<TypedProperty<std::string> >())
        {
            const aiString value = aiString(interpreted->Value());
            out_mat->AddProperty(&value, name.c_str(), 0, 0);
        }
    }

    // Add the textures' properties

    for (TextureMap::const_iterator it = textures.begin(); it != textures.end(); it++) {

        std::string name = prefix + it->first;

        const Texture* const tex = (*it).second;
        if (tex != nullptr)
        {
            aiString path;
            path.Set(tex->RelativeFilename());

            const Video* media = tex->Media();
            if (media != nullptr && media->ContentLength() > 0) {
                unsigned int index;

                VideoMap::const_iterator it = textures_converted.find(media);
                if (it != textures_converted.end()) {
                    index = (*it).second;
                }
                else {
                    index = ConvertVideo(*media);
                    textures_converted[media] = index;
                }

                // setup texture reference string (copied from ColladaLoader::FindFilenameForEffectTexture)
                path.data[0] = '*';
                path.length = 1 + ASSIMP_itoa10(path.data + 1, MAXLEN - 1, index);
            }

            out_mat->AddProperty(&path, (name + "|file").c_str(), aiTextureType_UNKNOWN, 0);

            aiUVTransform uvTrafo;
            // XXX handle all kinds of UV transformations
            uvTrafo.mScaling = tex->UVScaling();
            uvTrafo.mTranslation = tex->UVTranslation();
            out_mat->AddProperty(&uvTrafo, 1, (name + "|uvtrafo").c_str(), aiTextureType_UNKNOWN, 0);
 
            int uvIndex = 0;

            bool uvFound = false;
            const std::string& uvSet = PropertyGet<std::string>(tex->Props(), "UVSet", uvFound);
            if (uvFound) {
                // "default" is the name which usually appears in the FbxFileTexture template
                if (uvSet != "default" && uvSet.length()) {
                    // this is a bit awkward - we need to find a mesh that uses this
                    // material and scan its UV channels for the given UV name because
                    // assimp references UV channels by index, not by name.

                    // XXX: the case that UV channels may appear in different orders
                    // in meshes is unhandled. A possible solution would be to sort
                    // the UV channels alphabetically, but this would have the side
                    // effect that the primary (first) UV channel would sometimes
                    // be moved, causing trouble when users read only the first
                    // UV channel and ignore UV channel assignments altogether.

                    std::vector<aiMaterial*>::iterator materialIt = std::find(materials.begin(), materials.end(), out_mat);
                    const unsigned int matIndex = static_cast<unsigned int>(std::distance(materials.begin(), materialIt));

                    uvIndex = -1;
                    if (!mesh)
                    {
                        for (const MeshMap::value_type& v : meshes_converted) {
                            const MeshGeometry* const meshGeom = dynamic_cast<const MeshGeometry*>(v.first);
                            if (!meshGeom) {
                                continue;
                            }

                            const MatIndexArray& mats = meshGeom->GetMaterialIndices();
                            if (std::find(mats.begin(), mats.end(), matIndex) == mats.end()) {
                                continue;
                            }

                            int index = -1;
                            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                                if (meshGeom->GetTextureCoords(i).empty()) {
                                    break;
                                }
                                const std::string& name = meshGeom->GetTextureCoordChannelName(i);
                                if (name == uvSet) {
                                    index = static_cast<int>(i);
                                    break;
                                }
                            }
                            if (index == -1) {
                                FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                                continue;
                            }

                            if (uvIndex == -1) {
                                uvIndex = index;
                            }
                            else {
                                FBXImporter::LogWarn("the UV channel named " + uvSet + " appears at different positions in meshes, results will be wrong");
                            }
                        }
                    }
                    else
                    {
                        int index = -1;
                        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                            if (mesh->GetTextureCoords(i).empty()) {
                                break;
                            }
                            const std::string& name = mesh->GetTextureCoordChannelName(i);
                            if (name == uvSet) {
                                index = static_cast<int>(i);
                                break;
                            }
                        }
                        if (index == -1) {
                            FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                        }

                        if (uvIndex == -1) {
                            uvIndex = index;
                        }
                    }

                    if (uvIndex == -1) {
                        FBXImporter::LogWarn("failed to resolve UV channel " + uvSet + ", using first UV channel");
                        uvIndex = 0;
                    }
                }
            }

            out_mat->AddProperty(&uvIndex, 1, (name + "|uvwsrc").c_str(), aiTextureType_UNKNOWN, 0);
        }
            }
        }